

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O1

void __thiscall Api::startGame(Api *this)

{
  string string;
  undefined8 in_stack_ffffffffffffffc8;
  undefined1 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffffd8;
  
  puVar1 = &stack0xffffffffffffffe0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffffffd0,"tst","");
  string._M_string_length = (size_type)puVar1;
  string._M_dataplus._M_p = (pointer)in_stack_ffffffffffffffc8;
  string.field_2 = in_stack_ffffffffffffffd8;
  initFromFile(this,string);
  if (puVar1 != &stack0xffffffffffffffe0) {
    operator_delete(puVar1);
  }
  GameManager::shuffleDecks(&this->_game);
  GameManager::start(&this->_game);
  return;
}

Assistant:

void Api::startGame() {
    this->initFromFile("tst");
    this->_game.shuffleDecks();
    this->_game.start();
}